

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::retrieve_clusters
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint max_clusters,
          vector<crnlib::vector<unsigned_int>_> *clusters)

{
  undefined8 this_00;
  bool bVar1;
  uint uVar2;
  vector<unsigned_int> *other;
  vector<unsigned_int> *this_01;
  uint *puVar3;
  uint local_4c;
  vq_node *local_48;
  vq_node *cur_node;
  uint cur_node_index;
  undefined1 local_30 [8];
  vector<unsigned_int> stack;
  vector<crnlib::vector<unsigned_int>_> *clusters_local;
  uint max_clusters_local;
  clusterizer<crnlib::vec<2U,_float>_> *this_local;
  
  stack._8_8_ = clusters;
  vector<crnlib::vector<unsigned_int>_>::resize(clusters,0,false);
  vector<crnlib::vector<unsigned_int>_>::reserve
            ((vector<crnlib::vector<unsigned_int>_> *)stack._8_8_,max_clusters);
  vector<unsigned_int>::vector((vector<unsigned_int> *)local_30);
  vector<unsigned_int>::reserve((vector<unsigned_int> *)local_30,0x200);
  cur_node._0_4_ = 0;
  while( true ) {
    while( true ) {
      local_48 = vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::operator[]
                           (&this->m_nodes,(uint)cur_node);
      bVar1 = vq_node::is_leaf(local_48);
      this_00 = stack._8_8_;
      if ((bVar1) || ((int)max_clusters < local_48->m_codebook_index + 2)) break;
      cur_node._0_4_ = local_48->m_left;
      local_4c = local_48->m_right;
      vector<unsigned_int>::push_back((vector<unsigned_int> *)local_30,&local_4c);
    }
    uVar2 = vector<crnlib::vector<unsigned_int>_>::size
                      ((vector<crnlib::vector<unsigned_int>_> *)stack._8_8_);
    vector<crnlib::vector<unsigned_int>_>::resize
              ((vector<crnlib::vector<unsigned_int>_> *)this_00,uVar2 + 1,false);
    other = &local_48->m_vectors;
    this_01 = vector<crnlib::vector<unsigned_int>_>::back
                        ((vector<crnlib::vector<unsigned_int>_> *)stack._8_8_);
    vector<unsigned_int>::operator=(this_01,other);
    bVar1 = vector<unsigned_int>::empty((vector<unsigned_int> *)local_30);
    if (bVar1) break;
    puVar3 = vector<unsigned_int>::back((vector<unsigned_int> *)local_30);
    cur_node._0_4_ = *puVar3;
    vector<unsigned_int>::pop_back((vector<unsigned_int> *)local_30);
  }
  vector<unsigned_int>::~vector((vector<unsigned_int> *)local_30);
  return;
}

Assistant:

void retrieve_clusters(uint max_clusters, crnlib::vector<crnlib::vector<uint>>& clusters) const
        {
            clusters.resize(0);
            clusters.reserve(max_clusters);

            crnlib::vector<uint> stack;
            stack.reserve(512);

            uint cur_node_index = 0;

            for (;;)
            {
                const vq_node& cur_node = m_nodes[cur_node_index];

                if ((cur_node.is_leaf()) || ((cur_node.m_codebook_index + 2) > (int)max_clusters))
                {
                    clusters.resize(clusters.size() + 1);
                    clusters.back() = cur_node.m_vectors;

                    if (stack.empty())
                    {
                        break;
                    }
                    cur_node_index = stack.back();
                    stack.pop_back();
                    continue;
                }

                cur_node_index = cur_node.m_left;
                stack.push_back(cur_node.m_right);
            }
        }